

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O2

void Lpk_NodeCutsOne(Lpk_Man_t *p,Lpk_Cut_t *pCut,int Node)

{
  int *__dest;
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Abc_Obj_t *p_00;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  Lpk_Cut_t *pCut_00;
  
  if (((undefined1  [212])*pCut & (undefined1  [212])0xfc0) != (undefined1  [212])0x600) {
    p_00 = Abc_NtkObj(p->pNtk,Node);
    uVar3 = *(uint *)&p_00->field_0x14 & 0xf;
    if ((uVar3 != 2) && (uVar3 != 5)) {
      if (uVar3 != 7) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                      ,0x1ef,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
      }
      iVar4 = Abc_NodeIsTravIdCurrent(p_00);
      if (iVar4 == 0) {
        uVar5 = *(uint *)pCut >> 0xc & 0x3f;
        uVar3 = p->pPars->nLutsOver;
        if (uVar5 == uVar3) {
          return;
        }
        if ((int)uVar3 <= (int)uVar5) {
          __assert_fail("(int)pCut->nNodesDup < p->pPars->nLutsOver",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                        ,0x1f7,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
        }
      }
      iVar4 = (*(uint *)pCut & 0x3f) - 1;
      uVar3 = (p_00->vFanins).nSize;
      uVar11 = 0;
      uVar8 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar8 = uVar11;
      }
      for (; uVar8 != uVar11; uVar11 = uVar11 + 1) {
        uVar3 = *(uint *)((long)p_00->pNtk->vObjs->pArray[(p_00->vFanins).pArray[uVar11]] + 0x10);
        if ((*(uint *)((long)pCut->uSign + (ulong)(uVar3 >> 3 & 4)) >> (uVar3 & 0x1f) & 1) == 0) {
          if (p->pPars->nVarsMax <= iVar4) {
            return;
          }
          iVar4 = iVar4 + 1;
        }
      }
      lVar6 = (long)p->nCuts;
      if (0x1ff < lVar6) {
        __assert_fail("p->nCuts < LPK_CUTS_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                      ,0x205,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
      }
      pCut_00 = p->pCuts + lVar6;
      uVar3 = *(uint *)pCut_00 & 0xffffffc0;
      *(uint *)pCut_00 = uVar3;
      for (uVar8 = 0; uVar8 < (*(uint *)pCut & 0x3f); uVar8 = uVar8 + 1) {
        iVar4 = pCut->pLeaves[uVar8];
        if (iVar4 != Node) {
          uVar5 = uVar3 & 0x3f;
          uVar3 = uVar3 & 0xffffffc0 | uVar3 + 1 & 0x3f;
          *(uint *)pCut_00 = uVar3;
          p->pCuts[lVar6].pLeaves[uVar5] = iVar4;
        }
      }
      for (lVar9 = 0; lVar9 < (p_00->vFanins).nSize; lVar9 = lVar9 + 1) {
        pvVar2 = p_00->pNtk->vObjs->pArray[(p_00->vFanins).pArray[lVar9]];
        uVar8 = (ulong)(uVar3 & 0x3f);
        for (uVar11 = 0; uVar13 = uVar8, uVar8 != uVar11; uVar11 = uVar11 + 1) {
          iVar4 = *(int *)((long)pvVar2 + 0x10);
          if (iVar4 <= p->pCuts[lVar6].pLeaves[uVar11]) {
            uVar13 = uVar11;
            if (p->pCuts[lVar6].pLeaves[uVar11] == iVar4) goto LAB_003d13ed;
            break;
          }
        }
        if ((uVar3 & 0x3f) == p->pPars->nVarsMax) {
          return;
        }
        for (; (long)(int)uVar13 < (long)uVar8; uVar8 = uVar8 - 1) {
          p->pCuts[lVar6].pLeaves[uVar8] = p->pCuts[lVar6].pLeaves[uVar8 - 1];
        }
        p->pCuts[lVar6].pLeaves[uVar13 & 0xffffffff] = *(int *)((long)pvVar2 + 0x10);
        uVar5 = *(uint *)pCut_00 + 1 & 0x3f;
        uVar3 = *(uint *)pCut_00 & 0xffffffc0 | uVar5;
        *(uint *)pCut_00 = uVar3;
        if (0x18 < uVar5) {
          __assert_fail("pCutNew->nLeaves <= LPK_SIZE_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                        ,0x21d,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
        }
LAB_003d13ed:
      }
      Lpk_NodeCutSignature(pCut_00);
      iVar4 = Lpk_NodeCutsOneFilter(p->pCuts,p->nCuts,pCut_00);
      if (iVar4 == 0) {
        uVar3 = *(uint *)pCut >> 6 & 0x3f;
        if (0x17 < uVar3) {
          __assert_fail("pCut->nNodes < LPK_SIZE_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                        ,0x226,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
        }
        __dest = p->pCuts[lVar6].pNodes;
        memcpy(__dest,pCut->pNodes,(ulong)(uVar3 << 2));
        uVar3 = *(uint *)pCut;
        uVar5 = *(uint *)pCut_00;
        *(uint *)pCut_00 = uVar5 & 0xfffff03f | uVar3 & 0xfc0;
        uVar1 = *(uint *)pCut;
        uVar7 = uVar5 & 0xfffc003f | uVar3 & 0xfc0 | uVar1 & 0x3f000;
        *(uint *)pCut_00 = uVar7;
        uVar10 = uVar3 >> 6;
        uVar12 = uVar10 & 0x3f;
        uVar8 = 0;
        while( true ) {
          if (uVar12 == uVar8) goto LAB_003d14b0;
          if (__dest[uVar8] == Node) break;
          uVar8 = uVar8 + 1;
        }
        for (uVar11 = uVar8; (long)uVar11 < (long)(int)((uVar10 & 0x3f) - 1); uVar11 = uVar11 + 1) {
          __dest[uVar11] = p->pCuts[lVar6].pNodes[uVar11 + 1];
        }
        __dest[uVar11] = Node;
        uVar12 = (uint)uVar8;
LAB_003d14b0:
        uVar10 = uVar10 & 0x3f;
        if (uVar12 == uVar10) {
          *(uint *)pCut_00 = uVar5 & 0xfffc003f | uVar1 & 0x3f000 | uVar3 + 0x40 & 0xfc0;
          p->pCuts[lVar6].pNodes[uVar10] = Node;
          uVar5 = Abc_NodeIsTravIdCurrent(p_00);
          uVar3 = *(uint *)pCut_00;
          uVar7 = uVar3 & 0xfffc0fff | (uVar5 ^ 1) * 0x1000 + uVar3 & 0x3f000;
          *(uint *)pCut_00 = uVar7;
          uVar10 = uVar3 >> 6 & 0x3f;
        }
        if ((int)((uVar7 >> 0xc & 0x3f) + p->nMffc) < (int)uVar10) {
          __assert_fail("pCutNew->nNodes <= p->nMffc + pCutNew->nNodesDup",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                        ,0x23b,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
        }
        if (0x1ff < p->nCuts) {
          __assert_fail("p->nCuts < LPK_CUTS_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCut.c"
                        ,0x23d,"void Lpk_NodeCutsOne(Lpk_Man_t *, Lpk_Cut_t *, int)");
        }
        p->nCuts = p->nCuts + 1;
      }
    }
  }
  return;
}

Assistant:

void Lpk_NodeCutsOne( Lpk_Man_t * p, Lpk_Cut_t * pCut, int Node )
{
    Lpk_Cut_t * pCutNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, j, nLeavesNew;
/*
    printf( "Exploring cut " );
    Lpk_NodePrintCut( p, pCut, 1 );
    printf( "with node %d\n", Node );
*/
    // check if the cut can stand adding one more internal node
    if ( pCut->nNodes == LPK_SIZE_MAX )
        return;

    // if the node is a PI, quit
    pObj = Abc_NtkObj( p->pNtk, Node );
    if ( Abc_ObjIsCi(pObj) )
        return;
    assert( Abc_ObjIsNode(pObj) );
//    assert( Abc_ObjFaninNum(pObj) <= p->pPars->nLutSize );

    // if the node is not in the MFFC, check the limit
    if ( !Abc_NodeIsTravIdCurrent(pObj) )
    {
        if ( (int)pCut->nNodesDup == p->pPars->nLutsOver )
            return;
        assert( (int)pCut->nNodesDup < p->pPars->nLutsOver );
    }

    // check the possibility of adding this node using the signature
    nLeavesNew = pCut->nLeaves - 1;
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        if ( (pCut->uSign[(pFanin->Id & 32) > 0] & (1 << (pFanin->Id & 31))) )
            continue;
        if ( ++nLeavesNew > p->pPars->nVarsMax )
            return;
    }

    // initialize the set of leaves to the nodes in the cut
    assert( p->nCuts < LPK_CUTS_MAX );
    pCutNew = p->pCuts + p->nCuts;
    pCutNew->nLeaves = 0;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( pCut->pLeaves[i] != Node )
            pCutNew->pLeaves[pCutNew->nLeaves++] = pCut->pLeaves[i];

    // add new nodes
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        // find the place where this node belongs
        for ( k = 0; k < (int)pCutNew->nLeaves; k++ )
            if ( pCutNew->pLeaves[k] >= pFanin->Id )
                break;
        if ( k < (int)pCutNew->nLeaves && pCutNew->pLeaves[k] == pFanin->Id )
            continue;
        // check if there is room
        if ( (int)pCutNew->nLeaves == p->pPars->nVarsMax )
            return;
        // move all the nodes
        for ( j = pCutNew->nLeaves; j > k; j-- )
            pCutNew->pLeaves[j] = pCutNew->pLeaves[j-1];
        pCutNew->pLeaves[k] = pFanin->Id;
        pCutNew->nLeaves++;
        assert( pCutNew->nLeaves <= LPK_SIZE_MAX );

    }
    // skip the contained cuts
    Lpk_NodeCutSignature( pCutNew );
    if ( Lpk_NodeCutsOneFilter( p->pCuts, p->nCuts, pCutNew ) )
        return;

    // update the set of internal nodes
    assert( pCut->nNodes < LPK_SIZE_MAX );
    memcpy( pCutNew->pNodes, pCut->pNodes, pCut->nNodes * sizeof(int) );
    pCutNew->nNodes = pCut->nNodes;
    pCutNew->nNodesDup = pCut->nNodesDup;

    // check if the node is already there
    // if so, move the node to be the last
    for ( i = 0; i < (int)pCutNew->nNodes; i++ )
        if ( pCutNew->pNodes[i] == Node )
        {
            for ( k = i; k < (int)pCutNew->nNodes - 1; k++ )
                pCutNew->pNodes[k] = pCutNew->pNodes[k+1];
            pCutNew->pNodes[k] = Node;
            break;
        }
    if ( i == (int)pCutNew->nNodes ) // new node
    {
        pCutNew->pNodes[ pCutNew->nNodes++ ] = Node;
        pCutNew->nNodesDup += !Abc_NodeIsTravIdCurrent(pObj);
    }
    // the number of nodes does not exceed MFFC plus duplications
    assert( pCutNew->nNodes <= p->nMffc + pCutNew->nNodesDup );
    // add the cut to storage
    assert( p->nCuts < LPK_CUTS_MAX );
    p->nCuts++;
}